

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O1

void boost::throw_exception<boost::bad_get>(bad_get *e)

{
  clone_impl<boost::exception_detail::error_info_injector<boost::bad_get>_> *this;
  error_info_injector<boost::bad_get> local_48;
  
  this = (clone_impl<boost::exception_detail::error_info_injector<boost::bad_get>_> *)
         __cxa_allocate_exception(0x38);
  local_48.super_exception.data_.px_ = (error_info_container *)0x0;
  local_48.super_exception.throw_function_ = (char *)0x0;
  local_48.super_exception.throw_file_ = (char *)0x0;
  local_48.super_exception.throw_line_ = -1;
  local_48.super_bad_get = (bad_get)&PTR__error_info_injector_0018d9b0;
  local_48.super_exception._vptr_exception = (_func_int **)&PTR__error_info_injector_0018d9d8;
  exception_detail::clone_impl<boost::exception_detail::error_info_injector<boost::bad_get>_>::
  clone_impl(this,&local_48);
  __cxa_throw(this,&exception_detail::
                    clone_impl<boost::exception_detail::error_info_injector<boost::bad_get>>::
                    typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<boost::bad_get>_>::~clone_impl
             );
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}